

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Dsp.cpp
# Opt level: O3

void __thiscall Spc_Dsp::run(Spc_Dsp *this,int clock_count)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  byte bVar7;
  uint uVar8;
  uint8_t *puVar9;
  int *piVar10;
  sample_t_conflict1 *psVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  sample_t_conflict1 *psVar15;
  byte bVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  int (*paiVar21) [2];
  ulong uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  env_mode_t eVar27;
  voice_t *pvVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  uint8_t *puVar33;
  int iVar34;
  voice_t *pvVar35;
  sample_t_conflict1 sVar36;
  int iVar37;
  short sVar38;
  uint uVar39;
  int iVar40;
  uint uVar41;
  ulong uVar42;
  uint uVar43;
  int iVar44;
  bool bVar45;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  
  uVar25 = clock_count + (this->m).phase;
  (this->m).phase = uVar25 & 0x1f;
  if (0x1f < uVar25) {
    iVar26 = (int)uVar25 >> 5;
    puVar9 = (this->m).ram;
    bVar2 = (this->m).regs[0x5d];
    bVar3 = (this->m).regs[0x2d];
    bVar4 = (this->m).regs[0x3d];
    uVar25 = (this->m).regs[0x6c] & 0x1f;
    iVar12 = (int)(char)(this->m).regs[0xc];
    iVar17 = (int)(char)(this->m).regs[0x1c];
    iVar29 = -iVar12;
    if ((this->m).surround_threshold <= iVar17 * iVar12) {
      iVar29 = iVar12;
    }
    uVar8 = counter_mask[uVar25];
    do {
      uVar13 = (this->m).every_other_sample;
      (this->m).every_other_sample = uVar13 ^ 1;
      if (uVar13 != 1) {
        uVar13 = ~(this->m).kon & (this->m).new_kon;
        (this->m).new_kon = uVar13;
        (this->m).kon = uVar13;
        (this->m).t_koff = (uint)(this->m).regs[0x5c];
      }
      uVar13 = (this->m).counters[1];
      uVar14 = (this->m).counters[2];
      *(ulong *)((this->m).counters + 1) =
           CONCAT44((uVar14 - 1) + (-(uint)((uVar14 & 7) == 0) & 0xfffffffc),
                    (uVar13 - 1) + (-(uint)((uVar13 & 7) == 0) & 0xfffffffb));
      uVar13 = (this->m).counters[3];
      (this->m).counters[3] = (uVar13 - 4) + (uint)((uVar13 & 7) != 0) * 3;
      if ((*(this->m).counter_select[uVar25] & uVar8) == 0) {
        iVar12 = (this->m).noise;
        (this->m).noise = iVar12 >> 1 ^ (iVar12 << 0xe ^ iVar12 << 0xd) & 0x4000U;
      }
      local_94 = 0;
      uVar13 = 1;
      local_98 = 0;
      local_8c = 0;
      local_90 = 0;
      uVar14 = 0;
      puVar33 = (uint8_t *)this;
      pvVar35 = (this->m).voices;
      do {
        uVar41 = (uint)puVar9[pvVar35->brr_addr];
        if (pvVar35->kon_delay < 1) {
          iVar12 = (int)(((int)uVar14 >> 5) * (*(ushort *)(puVar33 + 2) & 0x3fff)) >> 10;
          if (((this->m).regs[0x2d] & uVar13) == 0) {
            iVar12 = 0;
          }
          iVar12 = iVar12 + (*(ushort *)(puVar33 + 2) & 0x3fff);
          uVar18 = pvVar35->env;
          puVar33[8] = (uint8_t)(uVar18 >> 4);
          if (uVar18 == 0) goto LAB_0059f2ce;
          uVar22 = (ulong)((uint)pvVar35->interp_pos >> 3 & 0x1fe);
          piVar10 = pvVar35->buf_pos;
          uVar42 = (ulong)((uint)pvVar35->interp_pos >> 0xc);
          if (((byte)(bVar4 | bVar3 >> 1) & uVar13) == 0) {
            uVar14 = (int)(((int)interleved_gauss[0x1fe - uVar22] * piVar10[uVar42 + 3] +
                            (int)interleved_gauss[0x1ff - uVar22] * piVar10[uVar42 + 2] +
                            (int)interleved_gauss[uVar22 + 1] * piVar10[uVar42 + 1] +
                            (int)interleved_gauss[uVar22] * piVar10[uVar42] >> 0xb) * uVar18) >> 0xb
            ;
          }
          else {
            if ((uVar13 & (this->m).regs[0x3d]) == 0) {
              uVar14 = ((int)interleved_gauss[0x1fe - uVar22] * piVar10[uVar42 + 3] >> 0xb) +
                       (int)(short)((short)((uint)((int)interleved_gauss[0x1ff - uVar22] *
                                                  piVar10[uVar42 + 2]) >> 0xb) +
                                   (short)((uint)((int)interleved_gauss[uVar22 + 1] *
                                                 piVar10[uVar42 + 1]) >> 0xb) +
                                   (short)((uint)((int)interleved_gauss[uVar22] * piVar10[uVar42])
                                          >> 0xb));
              if ((int)uVar14 < -0x7fff) {
                uVar14 = 0xffff8000;
              }
              if (0x7ffe < (int)uVar14) {
                uVar14 = 0x7fff;
              }
              uVar14 = uVar14 & 0xfffffffe;
            }
            else {
              uVar14 = (uint)(short)((short)(this->m).noise * 2);
            }
            uVar14 = (int)(uVar14 * uVar18) >> 0xb & 0xfffffffe;
          }
          iVar44 = pvVar35->volume[0] * uVar14;
          iVar19 = pvVar35->volume[1] * uVar14;
          local_90 = local_90 + iVar44;
          local_8c = local_8c + iVar19;
          if (((this->m).regs[0x4d] & uVar13) == 0) {
            iVar44 = 0;
            iVar19 = 0;
          }
          local_94 = local_94 + iVar19;
          local_98 = local_98 + iVar44;
        }
        else {
          uVar14 = pvVar35->kon_delay - 1;
          pvVar35->kon_delay = uVar14;
          if (uVar14 == 4) {
            pvVar35->brr_addr =
                 (uint)*(ushort *)(puVar9 + (ulong)puVar33[4] * 4 + (ulong)bVar2 * 0x100);
            pvVar35->brr_offset = 1;
            pvVar35->buf_pos = pvVar35->buf;
            uVar41 = 0;
          }
          pvVar35->env = 0;
          pvVar35->hidden_env = 0;
          pvVar35->interp_pos = (uint)((uVar14 & 3) != 0) << 0xe;
          puVar33[8] = '\0';
          iVar12 = 0;
LAB_0059f2ce:
          uVar18 = 0;
          uVar14 = 0;
        }
        puVar33[9] = (uint8_t)(uVar14 >> 8);
        if (((char)(this->m).regs[0x6c] < '\0') || ((uVar41 & 3) == 1)) {
          pvVar35->env_mode = env_release;
          uVar18 = 0;
        }
        if ((this->m).every_other_sample != 0) {
          if (((this->m).t_koff & uVar13) != 0) {
            pvVar35->env_mode = env_release;
          }
          if (((this->m).kon & uVar13) != 0) {
            pvVar35->kon_delay = 5;
            pvVar35->env_mode = env_attack;
            puVar1 = (this->m).regs + 0x7c;
            *puVar1 = *puVar1 & ~(byte)uVar13;
          }
        }
        if (pvVar35->kon_delay == 0) {
          eVar27 = pvVar35->env_mode;
          if (eVar27 != env_release) {
            bVar16 = puVar33[5];
            if ((char)bVar16 < '\0') {
              if ((int)eVar27 < 3) {
                if (eVar27 == env_decay) {
                  uVar20 = (uVar18 - 1) - ((int)(uVar18 - 1) >> 8);
                  uVar39 = bVar16 >> 3 & 0xfffffffe;
                  eVar27 = env_decay;
                  if ((int)uVar20 >> 8 == (uint)(puVar33[6] >> 5)) goto LAB_0059f732;
                }
                else {
                  uVar43 = (uint)bVar16 * 2 & 0x1e;
                  uVar39 = uVar43 + 1;
                  uVar20 = uVar18 + 0x400;
                  if (uVar43 != 0x1e) {
                    uVar20 = uVar18 + 0x20;
                  }
                }
                goto LAB_0059f75f;
              }
              uVar20 = (uVar18 - 1) - ((int)(uVar18 - 1) >> 8);
              uVar18 = puVar33[6] & 0x1f;
              pvVar35->hidden_env = uVar20;
              uVar18 = *(this->m).counter_select[uVar18] & counter_mask[uVar18];
            }
            else {
              bVar16 = puVar33[7];
              uVar43 = (uint)(bVar16 >> 5);
              if ((char)bVar16 < '\0') {
                uVar39 = bVar16 & 0x1f;
                if (uVar43 == 4) {
                  uVar20 = uVar18 - 0x20;
                }
                else if (bVar16 < 0xc0) {
                  uVar20 = (uVar18 - 1) - ((int)(uVar18 - 1) >> 8);
                }
                else {
                  uVar20 = uVar18 + 0x20;
                  if ((uVar43 == 7) && (0x5ff < (uint)pvVar35->hidden_env)) {
                    uVar20 = uVar18 + 8;
                  }
                }
              }
              else {
                uVar39 = 0x1f;
                uVar20 = (uint)bVar16 << 4;
              }
              if ((eVar27 == env_decay) && ((int)uVar20 >> 8 == uVar43)) {
LAB_0059f732:
                pvVar35->env_mode = env_sustain;
                eVar27 = env_sustain;
              }
LAB_0059f75f:
              pvVar35->hidden_env = uVar20;
              if (0x7ff < uVar20) {
                bVar45 = (int)uVar20 < 0;
                uVar20 = 0x7ff;
                if (bVar45) {
                  uVar20 = 0;
                }
                if (eVar27 == env_attack) {
                  pvVar35->env_mode = env_decay;
                }
              }
              uVar18 = *(this->m).counter_select[uVar39] & counter_mask[uVar39];
            }
            if (uVar18 == 0) {
              pvVar35->env = uVar20;
            }
            goto LAB_0059f49a;
          }
          pvVar35->env = uVar18 - 8;
          if (8 < (int)uVar18) goto LAB_0059f49a;
          pvVar35->env = 0;
        }
        else {
LAB_0059f49a:
          uVar18 = pvVar35->interp_pos;
          iVar12 = (uVar18 & 0x3fff) + iVar12;
          if (0x7ffe < iVar12) {
            iVar12 = 0x7fff;
          }
          pvVar35->interp_pos = iVar12;
          if (0x3fff < (int)uVar18) {
            iVar12 = pvVar35->brr_addr;
            iVar44 = pvVar35->brr_offset;
            uVar5 = puVar9[iVar44 + iVar12 & 0xffff];
            uVar6 = puVar9[iVar44 + iVar12 + 1U & 0xffff];
            if (iVar44 < 7) {
              iVar44 = iVar44 + 2;
            }
            else {
              if ((uVar41 & 1) == 0) {
                uVar18 = iVar12 + 9U & 0xffff;
              }
              else {
                uVar18 = (uint)*(ushort *)
                                (puVar9 + (ulong)puVar33[4] * 4 + (ulong)bVar2 * 0x100 + 2);
                if (pvVar35->kon_delay == 0) {
                  puVar1 = (this->m).regs + 0x7c;
                  *puVar1 = *puVar1 | (byte)uVar13;
                }
              }
              pvVar35->brr_addr = uVar18;
              iVar44 = 1;
            }
            sVar38 = CONCAT11(uVar5,uVar6);
            pvVar35->brr_offset = iVar44;
            bVar16 = "\r\f\f\f\f\f\f\f\f\f\f\f\f\x10\x10\x10"[uVar41 >> 4];
            bVar7 = "\r\f\f\f\f\f\f\f\f\f\f\f\f\x10\x10\x10"[(ulong)(uVar41 >> 4) + 0x10];
            piVar10 = pvVar35->buf_pos;
            uVar41 = uVar41 & 0xc;
            iVar12 = piVar10[0xb];
            uVar42 = 0xfffffffffffffffc;
            do {
              iVar44 = ((int)sVar38 >> (bVar16 & 0x1f)) << (bVar7 & 0x1f);
              if (uVar41 < 8) {
                if (uVar41 != 0) {
                  iVar44 = (-iVar12 >> 5) + (iVar12 >> 1) + iVar44;
                }
              }
              else {
                iVar19 = *(int *)((long)piVar10 + uVar42 + 0x2c);
                iVar23 = iVar19 >> 1;
                if (uVar41 == 8) {
                  iVar19 = iVar19 >> 5;
                  iVar24 = iVar12 * -3 >> 6;
                }
                else {
                  iVar19 = iVar12 * -0xd >> 7;
                  iVar24 = iVar23 * 3 >> 4;
                }
                iVar44 = ((iVar44 + iVar12) - iVar23) + iVar24 + iVar19;
              }
              if (iVar44 < -0x7fff) {
                iVar44 = -0x8000;
              }
              if (0x7ffe < iVar44) {
                iVar44 = 0x7fff;
              }
              iVar12 = (int)(short)((short)iVar44 * 2);
              *(int *)((long)piVar10 + uVar42 + 4) = iVar12;
              *(int *)((long)piVar10 + uVar42 + 0x34) = iVar12;
              sVar38 = sVar38 << 4;
              uVar42 = uVar42 + 4;
            } while (uVar42 < 0xc);
            pvVar28 = (voice_t *)(piVar10 + 4);
            if (pvVar35->buf + 0xc <= (voice_t *)(piVar10 + 4)) {
              pvVar28 = pvVar35;
            }
            pvVar35->buf_pos = pvVar28->buf;
          }
        }
        uVar13 = uVar13 * 2;
        puVar33 = puVar33 + 0x10;
        pvVar35 = pvVar35 + 1;
      } while ((int)uVar13 < 0x100);
      iVar12 = (this->m).echo_offset;
      bVar16 = (this->m).regs[0x6d];
      if (iVar12 == 0) {
        iVar44 = ((this->m).regs[0x7d] & 0xf) << 0xb;
        (this->m).echo_length = iVar44;
      }
      else {
        iVar44 = (this->m).echo_length;
      }
      iVar19 = iVar12 + 4;
      if (iVar44 <= iVar19) {
        iVar19 = 0;
      }
      uVar42 = (ulong)((uint)bVar16 * 0x100 + iVar12 & 0xffff);
      (this->m).echo_offset = iVar19;
      iVar12 = (int)*(short *)(puVar9 + uVar42);
      paiVar21 = (this->m).echo_hist_pos + 1;
      if ((this->m).echo_hist + 8 <= paiVar21) {
        paiVar21 = (this->m).echo_hist;
      }
      iVar23 = (int)*(short *)(puVar9 + uVar42 + 2);
      (this->m).echo_hist_pos = paiVar21;
      paiVar21[8][0] = iVar12;
      (*paiVar21)[0] = iVar12;
      paiVar21[8][1] = iVar23;
      (*paiVar21)[1] = iVar23;
      iVar30 = (int)(char)(this->m).regs[0x7f];
      iVar34 = (int)(char)(this->m).regs[0xf];
      iVar40 = (int)(char)(this->m).regs[0x1f];
      iVar44 = (int)(char)(this->m).regs[0x2f];
      iVar31 = (int)(char)(this->m).regs[0x3f];
      iVar37 = (int)(char)(this->m).regs[0x4f];
      iVar32 = (int)(char)(this->m).regs[0x5f];
      iVar19 = (int)(char)(this->m).regs[0x6f];
      iVar24 = paiVar21[7][0] * iVar19 +
               paiVar21[6][0] * iVar32 + paiVar21[5][0] * iVar37 + paiVar21[4][0] * iVar31 +
               paiVar21[3][0] * iVar44 + paiVar21[2][0] * iVar40 +
               paiVar21[1][0] * iVar34 + iVar12 * iVar30;
      iVar12 = iVar19 * paiVar21[7][1] +
               iVar32 * paiVar21[6][1] + iVar37 * paiVar21[5][1] + iVar31 * paiVar21[4][1] +
               iVar44 * paiVar21[3][1] + iVar40 * paiVar21[2][1] +
               iVar34 * paiVar21[1][1] + iVar30 * iVar23;
      bVar16 = (this->m).regs[0x6c];
      if ((bVar16 & 0x20) == 0) {
        iVar44 = (int)(char)(this->m).regs[0xd];
        iVar19 = (iVar24 * iVar44 >> 0xe) + (local_98 >> 7);
        iVar44 = (iVar44 * iVar12 >> 0xe) + (local_94 >> 7);
        if (iVar19 < -0x7fff) {
          iVar19 = -0x8000;
        }
        if (0x7ffe < iVar19) {
          iVar19 = 0x7fff;
        }
        if (iVar44 < -0x7fff) {
          iVar44 = -0x8000;
        }
        if (0x7ffe < iVar44) {
          iVar44 = 0x7fff;
        }
        puVar9[uVar42 + 1] = (uint8_t)((uint)iVar19 >> 8);
        puVar9[uVar42] = (uint8_t)iVar19;
        puVar9[uVar42 + 3] = (uint8_t)((uint)iVar44 >> 8);
        puVar9[uVar42 + 2] = (uint8_t)iVar44;
        bVar16 = (this->m).regs[0x6c];
      }
      iVar23 = iVar24 * (char)(this->m).regs[0x2c] + local_90 * iVar29;
      iVar44 = iVar23 >> 0xe;
      iVar19 = iVar12 * (char)(this->m).regs[0x3c] + local_8c * iVar17;
      iVar24 = iVar19 >> 0xe;
      iVar12 = (iVar23 < 0) + 0x7fff;
      if ((short)iVar44 == iVar44) {
        iVar12 = iVar44;
      }
      sVar36 = (sample_t_conflict1)iVar12;
      iVar12 = (iVar19 < 0) + 0x7fff;
      if ((short)iVar24 == iVar24) {
        iVar12 = iVar24;
      }
      bVar45 = (bVar16 & 0x40) != 0;
      if (bVar45) {
        sVar36 = 0;
      }
      psVar11 = (this->m).out;
      *psVar11 = sVar36;
      sVar36 = (sample_t_conflict1)iVar12;
      if (bVar45) {
        sVar36 = 0;
      }
      psVar11[1] = sVar36;
      psVar15 = psVar11 + 2;
      if ((this->m).out_end <= psVar11 + 2) {
        (this->m).out_end = (sample_t_conflict1 *)(this + 1);
        psVar15 = (this->m).extra;
      }
      (this->m).out = psVar15;
      iVar26 = iVar26 + -1;
    } while (iVar26 != 0);
  }
  return;
}

Assistant:

void Spc_Dsp::run( int clock_count )
{
	int new_phase = m.phase + clock_count;
	int count = new_phase >> 5;
	m.phase = new_phase & 31;
	if ( !count )
		return;
	
	uint8_t* const ram = m.ram;
	uint8_t const* const dir = &ram [REG(dir) * 0x100];
	int const slow_gaussian = (REG(pmon) >> 1) | REG(non);
	int const noise_rate = REG(flg) & 0x1F;
	
	// Global volume
	int mvoll = (int8_t) REG(mvoll);
	int mvolr = (int8_t) REG(mvolr);
	if ( mvoll * mvolr < m.surround_threshold )
		mvoll = -mvoll; // eliminate surround
	
	do
	{
		// KON/KOFF reading
		if ( (m.every_other_sample ^= 1) != 0 )
		{
			m.new_kon &= ~m.kon;
			m.kon    = m.new_kon;
			m.t_koff = REG(koff); 
		}
		
		run_counter( 1 );
		run_counter( 2 );
		run_counter( 3 );
		
		// Noise
		if ( !READ_COUNTER( noise_rate ) )
		{
			int feedback = (m.noise << 13) ^ (m.noise << 14);
			m.noise = (feedback & 0x4000) ^ (m.noise >> 1);
		}
		
		// Voices
		int pmon_input = 0;
		int main_out_l = 0;
		int main_out_r = 0;
		int echo_out_l = 0;
		int echo_out_r = 0;
		voice_t* v = m.voices;
		uint8_t* v_regs = m.regs;
		int vbit = 1;
		do
		{
			#define SAMPLE_PTR(i) GET_LE16A( &dir [VREG(v_regs,srcn) * 4 + i * 2] )
			
			int brr_header = ram [v->brr_addr];
			int kon_delay = v->kon_delay;
			
			// Pitch
			int pitch = GET_LE16A( &VREG(v_regs,pitchl) ) & 0x3FFF;
			if ( REG(pmon) & vbit )
				pitch += ((pmon_input >> 5) * pitch) >> 10;
			
			// KON phases
			if ( --kon_delay >= 0 )
			{
				v->kon_delay = kon_delay;
				
				// Get ready to start BRR decoding on next sample
				if ( kon_delay == 4 )
				{
					v->brr_addr   = SAMPLE_PTR( 0 );
					v->brr_offset = 1;
					v->buf_pos    = v->buf;
					brr_header    = 0; // header is ignored on this sample
				}
				
				// Envelope is never run during KON
				v->env        = 0;
				v->hidden_env = 0;
				
				// Disable BRR decoding until last three samples
				v->interp_pos = (kon_delay & 3 ? 0x4000 : 0);
				
				// Pitch is never added during KON
				pitch = 0;
			}
			
			int env = v->env;
			
			// Gaussian interpolation
			{
				int output = 0;
				VREG(v_regs,envx) = (uint8_t) (env >> 4);
				if ( env )
				{
					// Make pointers into gaussian based on fractional position between samples
					int offset = (unsigned) v->interp_pos >> 3 & 0x1FE;
					short const* fwd = interleved_gauss       + offset;
					short const* rev = interleved_gauss + 510 - offset; // mirror left half of gaussian
					
					int const* in = &v->buf_pos [(unsigned) v->interp_pos >> 12];
					
					if ( !(slow_gaussian & vbit) ) // 99%
					{
						// Faster approximation when exact sample value isn't necessary for pitch mod
						output = (fwd [0] * in [0] +
						          fwd [1] * in [1] +
						          rev [1] * in [2] +
						          rev [0] * in [3]) >> 11;
						output = (output * env) >> 11;
					}
					else
					{
						output = (int16_t) (m.noise * 2);
						if ( !(REG(non) & vbit) )
						{
							output  = (fwd [0] * in [0]) >> 11;
							output += (fwd [1] * in [1]) >> 11;
							output += (rev [1] * in [2]) >> 11;
							output = (int16_t) output;
							output += (rev [0] * in [3]) >> 11;
							
							CLAMP16( output );
							output &= ~1;
						}
						output = (output * env) >> 11 & ~1;
					}
					
					// Output
					int l = output * v->volume [0];
					int r = output * v->volume [1];
					
					main_out_l += l;
					main_out_r += r;
					
					if ( REG(eon) & vbit )
					{
						echo_out_l += l;
						echo_out_r += r;
					}
				}
				
				pmon_input = output;
				VREG(v_regs,outx) = (uint8_t) (output >> 8);
			}
			
			// Soft reset or end of sample
			if ( REG(flg) & 0x80 || (brr_header & 3) == 1 )
			{
				v->env_mode = env_release;
				env         = 0;
			}
			
			if ( m.every_other_sample )
			{
				// KOFF
				if ( m.t_koff & vbit )
					v->env_mode = env_release;
				
				// KON
				if ( m.kon & vbit )
				{
					v->kon_delay = 5;
					v->env_mode  = env_attack;
					REG(endx) &= ~vbit;
				}
			}
			
			// Envelope
			if ( !v->kon_delay )
			{
				if ( v->env_mode == env_release ) // 97%
				{
					env -= 0x8;
					v->env = env;
					if ( env <= 0 )
					{
						v->env = 0;
						goto skip_brr; // no BRR decoding for you!
					}
				}
				else // 3%
				{
					int rate;
					int const adsr0 = VREG(v_regs,adsr0);
					int env_data = VREG(v_regs,adsr1);
					if ( adsr0 >= 0x80 ) // 97% ADSR
					{
						if ( v->env_mode > env_decay ) // 89%
						{
							env--;
							env -= env >> 8;
							rate = env_data & 0x1F;
							
							// optimized handling
							v->hidden_env = env;
							if ( READ_COUNTER( rate ) )
								goto exit_env;
							v->env = env;
							goto exit_env;
						}
						else if ( v->env_mode == env_decay )
						{
							env--;
							env -= env >> 8;
							rate = (adsr0 >> 3 & 0x0E) + 0x10;
						}
						else // env_attack
						{
							rate = (adsr0 & 0x0F) * 2 + 1;
							env += rate < 31 ? 0x20 : 0x400;
						}
					}
					else // GAIN
					{
						int mode;
						env_data = VREG(v_regs,gain);
						mode = env_data >> 5;
						if ( mode < 4 ) // direct
						{
							env = env_data * 0x10;
							rate = 31;
						}
						else
						{
							rate = env_data & 0x1F;
							if ( mode == 4 ) // 4: linear decrease
							{
								env -= 0x20;
							}
							else if ( mode < 6 ) // 5: exponential decrease
							{
								env--;
								env -= env >> 8;
							}
							else // 6,7: linear increase
							{
								env += 0x20;
								if ( mode > 6 && (unsigned) v->hidden_env >= 0x600 )
									env += 0x8 - 0x20; // 7: two-slope linear increase
							}
						}
					}
					
					// Sustain level
					if ( (env >> 8) == (env_data >> 5) && v->env_mode == env_decay )
						v->env_mode = env_sustain;
					
					v->hidden_env = env;
					
					// unsigned cast because linear decrease going negative also triggers this
					if ( (unsigned) env > 0x7FF )
					{
						env = (env < 0 ? 0 : 0x7FF);
						if ( v->env_mode == env_attack )
							v->env_mode = env_decay;
					}
					
					if ( !READ_COUNTER( rate ) )
						v->env = env; // nothing else is controlled by the counter
				}
			}
		exit_env:
			
			{
				// Apply pitch
				int old_pos = v->interp_pos;
				int interp_pos = (old_pos & 0x3FFF) + pitch;
				if ( interp_pos > 0x7FFF )
					interp_pos = 0x7FFF;
				v->interp_pos = interp_pos;
				
				// BRR decode if necessary
				if ( old_pos >= 0x4000 )
				{
					// Arrange the four input nybbles in 0xABCD order for easy decoding
					int nybbles = ram [(v->brr_addr + v->brr_offset) & 0xFFFF] * 0x100 +
							ram [(v->brr_addr + v->brr_offset + 1) & 0xFFFF];
					
					// Advance read position
					int const brr_block_size = 9;
					int brr_offset = v->brr_offset;
					if ( (brr_offset += 2) >= brr_block_size )
					{
						// Next BRR block
						int brr_addr = (v->brr_addr + brr_block_size) & 0xFFFF;
						assert( brr_offset == brr_block_size );
						if ( brr_header & 1 )
						{
							brr_addr = SAMPLE_PTR( 1 );
							if ( !v->kon_delay )
								REG(endx) |= vbit;
						}
						v->brr_addr = brr_addr;
						brr_offset  = 1;
					}
					v->brr_offset = brr_offset;
					
					// Decode
					
					// 0: >>1  1: <<0  2: <<1 ... 12: <<11  13-15: >>4 <<11
					static unsigned char const shifts [16 * 2] = {
						13,12,12,12,12,12,12,12,12,12,12, 12, 12, 16, 16, 16,
						 0, 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 11, 11, 11
					};
					int const scale = brr_header >> 4;
					int const right_shift = shifts [scale];
					int const left_shift  = shifts [scale + 16];
					
					// Write to next four samples in circular buffer
					int* pos = v->buf_pos;
					int* end;
					
					// Decode four samples
					for ( end = pos + 4; pos < end; pos++, nybbles <<= 4 )
					{
						// Extract upper nybble and scale appropriately
						int s = ((int16_t) nybbles >> right_shift) << left_shift;
						
						// Apply IIR filter (8 is the most commonly used)
						int const filter = brr_header & 0x0C;
						int const p1 = pos [brr_buf_size - 1];
						int const p2 = pos [brr_buf_size - 2] >> 1;
						if ( filter >= 8 )
						{
							s += p1;
							s -= p2;
							if ( filter == 8 ) // s += p1 * 0.953125 - p2 * 0.46875
							{
								s += p2 >> 4;
								s += (p1 * -3) >> 6;
							}
							else // s += p1 * 0.8984375 - p2 * 0.40625
							{
								s += (p1 * -13) >> 7;
								s += (p2 * 3) >> 4;
							}
						}
						else if ( filter ) // s += p1 * 0.46875
						{
							s += p1 >> 1;
							s += (-p1) >> 5;
						}
						
						// Adjust and write sample
						CLAMP16( s );
						s = (int16_t) (s * 2);
						pos [brr_buf_size] = pos [0] = s; // second copy simplifies wrap-around
					}
					
					if ( pos >= &v->buf [brr_buf_size] )
						pos = v->buf;
					v->buf_pos = pos;
				}
			}
skip_brr:
			// Next voice
			vbit <<= 1;
			v_regs += 0x10;
			v++;
		}
		while ( vbit < 0x100 );
		
		// Echo position
		int echo_offset = m.echo_offset;
		uint8_t* const echo_ptr = &ram [(REG(esa) * 0x100 + echo_offset) & 0xFFFF];
		if ( !echo_offset )
			m.echo_length = (REG(edl) & 0x0F) * 0x800;
		echo_offset += 4;
		if ( echo_offset >= m.echo_length )
			echo_offset = 0;
		m.echo_offset = echo_offset;
		
		// FIR
		int echo_in_l = GET_LE16SA( echo_ptr + 0 );
		int echo_in_r = GET_LE16SA( echo_ptr + 2 );
		
		int (*echo_hist_pos) [2] = m.echo_hist_pos;
		if ( ++echo_hist_pos >= &m.echo_hist [echo_hist_size] )
			echo_hist_pos = m.echo_hist;
		m.echo_hist_pos = echo_hist_pos;
		
		echo_hist_pos [0] [0] = echo_hist_pos [8] [0] = echo_in_l;
		echo_hist_pos [0] [1] = echo_hist_pos [8] [1] = echo_in_r;
		
		#define CALC_FIR_( i, in )  ((in) * (int8_t) REG(fir + i * 0x10))
		echo_in_l = CALC_FIR_( 7, echo_in_l );
		echo_in_r = CALC_FIR_( 7, echo_in_r );
		
		#define CALC_FIR( i, ch )   CALC_FIR_( i, echo_hist_pos [i + 1] [ch] )
		#define DO_FIR( i )\
			echo_in_l += CALC_FIR( i, 0 );\
			echo_in_r += CALC_FIR( i, 1 );
		DO_FIR( 0 );
		DO_FIR( 1 );
		DO_FIR( 2 );
		#if defined (__MWERKS__) && __MWERKS__ < 0x3200
			__eieio(); // keeps compiler from stupidly "caching" things in memory
		#endif
		DO_FIR( 3 );
		DO_FIR( 4 );
		DO_FIR( 5 );
		DO_FIR( 6 );
		
		// Echo out
		if ( !(REG(flg) & 0x20) )
		{
			int l = (echo_out_l >> 7) + ((echo_in_l * (int8_t) REG(efb)) >> 14);
			int r = (echo_out_r >> 7) + ((echo_in_r * (int8_t) REG(efb)) >> 14);
			
			// just to help pass more validation tests
			#if SPC_MORE_ACCURACY
				l &= ~1;
				r &= ~1;
			#endif
			
			CLAMP16( l );
			CLAMP16( r );
			
			SET_LE16A( echo_ptr + 0, l );
			SET_LE16A( echo_ptr + 2, r );
		}
		
		// Sound out
		int l = (main_out_l * mvoll + echo_in_l * (int8_t) REG(evoll)) >> 14;
		int r = (main_out_r * mvolr + echo_in_r * (int8_t) REG(evolr)) >> 14;
		
		CLAMP16( l );
		CLAMP16( r );
		
		if ( (REG(flg) & 0x40) )
		{
			l = 0;
			r = 0;
		}
		
		sample_t* out = m.out;
		WRITE_SAMPLES( l, r, out );
		m.out = out;
	}
	while ( --count );
}